

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O2

int BIO_write_all(BIO *bio,void *data,size_t len)

{
  uint uVar1;
  ulong uVar2;
  
  do {
    if (len == 0) {
      return 1;
    }
    uVar2 = 0x7fffffff;
    if (len < 0x7fffffff) {
      uVar2 = len;
    }
    uVar1 = BIO_write((BIO *)bio,data,(int)uVar2);
    data = (void *)((long)data + (ulong)uVar1);
    len = len - uVar1;
  } while (0 < (int)uVar1);
  return 0;
}

Assistant:

int BIO_write_all(BIO *bio, const void *data, size_t len) {
  const uint8_t *data_u8 = reinterpret_cast<const uint8_t *>(data);
  while (len > 0) {
    int ret = BIO_write(bio, data_u8, len > INT_MAX ? INT_MAX : (int)len);
    if (ret <= 0) {
      return 0;
    }
    data_u8 += ret;
    len -= ret;
  }
  return 1;
}